

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O2

void __thiscall
dynet::NaryTreeLSTMBuilder::new_graph_impl
          (NaryTreeLSTMBuilder *this,ComputationGraph *cg,bool update)

{
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *this_00;
  vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
  *this_01;
  pointer pvVar1;
  pointer pvVar2;
  Parameter p_00;
  ComputationGraph *g;
  LookupParameterStorage *pLVar3;
  undefined7 in_register_00000011;
  pointer pvVar4;
  uint k;
  ulong uVar5;
  long lVar6;
  initializer_list<dynet::Expression> __l;
  Expression EVar7;
  allocator_type local_185;
  undefined4 local_184;
  ComputationGraph *local_180;
  undefined8 local_178;
  ComputationGraph *local_170;
  undefined8 local_168;
  ComputationGraph *local_160;
  undefined8 local_158;
  ComputationGraph *local_150;
  undefined8 local_148;
  ComputationGraph *local_140;
  undefined8 local_138;
  ComputationGraph *local_130;
  undefined8 local_128;
  ComputationGraph *local_120;
  pointer local_118;
  ComputationGraph *local_110;
  NaryTreeLSTMBuilder *local_108;
  vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
  *local_100;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *local_f8;
  ulong local_f0;
  LookupParameter p;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  lvars;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> vals;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> vars;
  
  local_184 = (undefined4)CONCAT71(in_register_00000011,update);
  this->cg = cg;
  this_00 = &this->param_vars;
  local_180 = cg;
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::clear(this_00);
  this_01 = &this->lparam_vars;
  std::
  vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
  ::clear(this_01);
  local_f8 = this_00;
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::reserve(this_00,(ulong)this->layers);
  local_100 = this_01;
  std::
  vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
  ::reserve(this_01,(ulong)this->layers);
  local_108 = this;
  for (local_f0 = 0; g = local_180, local_f0 < local_108->layers; local_f0 = local_f0 + 1) {
    pvVar2 = (local_108->params).
             super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar1 = pvVar2 + local_f0;
    pvVar4 = (local_108->lparams).
             super__Vector_base<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>,_std::allocator<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_f0;
    p_00.p = (ParameterStorage *)
             *pvVar2[local_f0].
              super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((char)local_184 == '\0') {
      EVar7 = const_parameter(local_180,p_00);
      local_118 = EVar7._8_8_;
      local_110 = EVar7.pg;
      EVar7 = const_parameter(g,*(ParameterStorage **)
                                 (*(long *)&(pvVar1->
                                            super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                            )._M_impl.super__Vector_impl_data + 8));
      local_128 = EVar7._8_8_;
      local_120 = EVar7.pg;
      EVar7 = const_parameter(g,*(ParameterStorage **)
                                 (*(long *)&(pvVar1->
                                            super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                            )._M_impl.super__Vector_impl_data + 0x10));
      local_138 = EVar7._8_8_;
      local_130 = EVar7.pg;
      EVar7 = const_parameter(g,*(ParameterStorage **)
                                 (*(long *)&(pvVar1->
                                            super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                            )._M_impl.super__Vector_impl_data + 0x18));
      local_148 = EVar7._8_8_;
      local_140 = EVar7.pg;
      EVar7 = const_parameter(g,*(ParameterStorage **)
                                 (*(long *)&(pvVar1->
                                            super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                            )._M_impl.super__Vector_impl_data + 0x20));
      local_158 = EVar7._8_8_;
      local_150 = EVar7.pg;
      EVar7 = const_parameter(g,*(ParameterStorage **)
                                 (*(long *)&(pvVar1->
                                            super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                            )._M_impl.super__Vector_impl_data + 0x28));
      local_168 = EVar7._8_8_;
      local_160 = EVar7.pg;
      EVar7 = const_parameter(g,*(ParameterStorage **)
                                 (*(long *)&(pvVar1->
                                            super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                            )._M_impl.super__Vector_impl_data + 0x30));
      local_178 = EVar7._8_8_;
      local_170 = EVar7.pg;
      const_parameter(g,*(ParameterStorage **)
                         (*(long *)&(pvVar1->
                                    super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                    )._M_impl.super__Vector_impl_data + 0x38));
    }
    else {
      EVar7 = parameter(local_180,p_00);
      local_118 = EVar7._8_8_;
      local_110 = EVar7.pg;
      EVar7 = parameter(g,*(ParameterStorage **)
                           (*(long *)&(pvVar1->
                                      super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                      )._M_impl.super__Vector_impl_data + 8));
      local_128 = EVar7._8_8_;
      local_120 = EVar7.pg;
      EVar7 = parameter(g,*(ParameterStorage **)
                           (*(long *)&(pvVar1->
                                      super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                      )._M_impl.super__Vector_impl_data + 0x10));
      local_138 = EVar7._8_8_;
      local_130 = EVar7.pg;
      EVar7 = parameter(g,*(ParameterStorage **)
                           (*(long *)&(pvVar1->
                                      super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                      )._M_impl.super__Vector_impl_data + 0x18));
      local_148 = EVar7._8_8_;
      local_140 = EVar7.pg;
      EVar7 = parameter(g,*(ParameterStorage **)
                           (*(long *)&(pvVar1->
                                      super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                      )._M_impl.super__Vector_impl_data + 0x20));
      local_158 = EVar7._8_8_;
      local_150 = EVar7.pg;
      EVar7 = parameter(g,*(ParameterStorage **)
                           (*(long *)&(pvVar1->
                                      super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                      )._M_impl.super__Vector_impl_data + 0x28));
      local_168 = EVar7._8_8_;
      local_160 = EVar7.pg;
      EVar7 = parameter(g,*(ParameterStorage **)
                           (*(long *)&(pvVar1->
                                      super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                      )._M_impl.super__Vector_impl_data + 0x30));
      local_178 = EVar7._8_8_;
      local_170 = EVar7.pg;
      parameter(g,*(ParameterStorage **)
                   (*(long *)&(pvVar1->
                              super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                              )._M_impl.super__Vector_impl_data + 0x38));
    }
    lvars.
    super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_110;
    lvars.
    super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_118;
    lvars.
    super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_120;
    __l._M_len = 8;
    __l._M_array = (iterator)&lvars;
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
              (&vars,__l,(allocator_type *)&vals);
    std::
    vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
    ::push_back(local_f8,&vars);
    std::
    vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
    ::vector(&lvars,(long)*(pointer *)
                           ((long)&(pvVar4->
                                   super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                                   )._M_impl.super__Vector_impl_data + 8) -
                    *(long *)&(pvVar4->
                              super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                              )._M_impl.super__Vector_impl_data >> 3,(allocator_type *)&vals);
    for (lVar6 = 0; lVar6 != 7; lVar6 = lVar6 + 1) {
      p.p = *(LookupParameterStorage **)
             (*(long *)&(pvVar4->
                        super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                        )._M_impl.super__Vector_impl_data + lVar6 * 8);
      pLVar3 = LookupParameter::get_storage(&p);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                (&vals,(long)(pLVar3->values).
                             super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pLVar3->values).
                             super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 6,&local_185);
      uVar5 = 0;
      while( true ) {
        pLVar3 = LookupParameter::get_storage(&p);
        if ((ulong)((long)(pLVar3->values).
                          super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pLVar3->values).
                          super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
                          super__Vector_impl_data._M_start >> 6) <= uVar5) break;
        vals.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5].i = 0;
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator=
                (lvars.
                 super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar6,&vals);
      std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base
                ((_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_> *)&vals);
    }
    std::
    vector<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>,_std::allocator<std::vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>_>_>
    ::push_back(local_100,&lvars);
    std::
    vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
    ::~vector(&lvars);
    std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base
              (&vars.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>);
  }
  return;
}

Assistant:

void NaryTreeLSTMBuilder::new_graph_impl(ComputationGraph& cg, bool update) {
  this->cg = &cg;
  param_vars.clear();
  lparam_vars.clear();
  param_vars.reserve(layers);
  lparam_vars.reserve(layers);

  for (unsigned i = 0; i < layers; ++i){
    auto& p = params[i];
    auto& lp = lparams[i];

    //i
    Expression i_x2i = update ? parameter(cg, p[X2I]) : const_parameter(cg, p[X2I]);
    Expression i_bi = update ? parameter(cg, p[BI]) : const_parameter(cg, p[BI]);
    //f
    Expression i_x2f = update ? parameter(cg, p[X2F]) : const_parameter(cg, p[X2F]);
    Expression i_bf = update ? parameter(cg, p[BF]) : const_parameter(cg, p[BF]);
    //o
    Expression i_x2o = update ? parameter(cg, p[X2O]) : const_parameter(cg, p[X2O]);
    Expression i_bo = update ? parameter(cg, p[BO]) : const_parameter(cg, p[BO]);
    //c
    Expression i_x2c = update ? parameter(cg, p[X2C]) : const_parameter(cg, p[X2C]);
    Expression i_bc = update ? parameter(cg, p[BC]) : const_parameter(cg, p[BC]);

    vector<Expression> vars = {i_x2i, i_bi, i_x2f, i_bf, i_x2o, i_bo, i_x2c, i_bc};
    param_vars.push_back(vars);

    DYNET_ASSERT(lp.size() == C2O + 1, "Dimension mismatch in TreeLSTM");
    vector<vector<Expression>> lvars(lp.size());
    for (unsigned p_type = H2I; p_type <= C2O; p_type++) {
    LookupParameter p = lp[p_type];
      vector<Expression> vals(p.get_storage().values.size());
      for (unsigned k = 0; k < p.get_storage().values.size(); ++k) {
        //vals[k] = lookup(cg, p, k);
        vals[k].i = 0;
      }
      lvars[p_type] = vals;
    }
    lparam_vars.push_back(lvars);
  }
}